

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O1

void Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CalculateHitGroupIndex
               (InstanceDesc *Desc,Uint32 *InstanceOffset,Uint32 HitGroupStride,
               HIT_GROUP_BINDING_MODE BindingMode)

{
  undefined7 in_register_00000009;
  uint *Args_1;
  string msg;
  Uint32 MaxIndex;
  string local_38;
  char local_14 [4];
  
  Args_1 = (uint *)CONCAT71(in_register_00000009,BindingMode);
  if (Desc->ContributionToHitGroupIndex != 0xffffffff) {
    if (BindingMode == HIT_GROUP_BINDING_MODE_LAST) goto switchD_001e98d0_caseD_2;
    FormatString<char[56]>
              (&local_38,(char (*) [56])"BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
    Args_1 = (uint *)0x17a;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17a);
    goto LAB_001e9895;
  }
  Desc->ContributionToHitGroupIndex = *InstanceOffset;
  Args_1 = &switchD_001e98d0::switchdataD_006bac9c;
  switch(BindingMode) {
  case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:
    HitGroupStride =
         HitGroupStride *
         (((Desc->pBLAS).m_pObject)->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
         m_GeometryCount;
  case HIT_GROUP_BINDING_MODE_PER_INSTANCE:
    *InstanceOffset = *InstanceOffset + HitGroupStride;
  case HIT_GROUP_BINDING_MODE_PER_TLAS:
    goto switchD_001e98d0_caseD_2;
  case HIT_GROUP_BINDING_MODE_LAST:
    FormatString<char[85]>
              (&local_38,
               (char (*) [85])
               "TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"
              );
    Args_1 = (uint *)0x173;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x173);
    break;
  default:
    FormatString<char[40]>(&local_38,(char (*) [40])"Unknown ray tracing shader binding mode");
    Args_1 = (uint *)0x174;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x174);
  }
LAB_001e9895:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
switchD_001e98d0_caseD_2:
  local_14[0] = '\0';
  local_14[1] = '\0';
  local_14[2] = '\0';
  local_14[3] = '\x01';
  if (0xffffff < Desc->ContributionToHitGroupIndex) {
    FormatString<char[47],unsigned_int>
              (&local_38,(Diligent *)"ContributionToHitGroupIndex must be less than ",
               (char (*) [47])local_14,Args_1);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

static void CalculateHitGroupIndex(InstanceDesc& Desc, Uint32& InstanceOffset, const Uint32 HitGroupStride, const HIT_GROUP_BINDING_MODE BindingMode)
    {
        static_assert(HIT_GROUP_BINDING_MODE_LAST == HIT_GROUP_BINDING_MODE_USER_DEFINED, "Please update the switch below to handle the new shader binding mode");

        if (Desc.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
        {
            Desc.ContributionToHitGroupIndex = InstanceOffset;
            switch (BindingMode)
            {
                // clang-format off
                case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     InstanceOffset += Desc.pBLAS->GetActualGeometryCount() * HitGroupStride;                            break;
                case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     InstanceOffset += HitGroupStride;                                                                   break;
                case HIT_GROUP_BINDING_MODE_PER_TLAS:         /* InstanceOffset is constant */                                                                  break;
                case HIT_GROUP_BINDING_MODE_USER_DEFINED:     UNEXPECTED("TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"); break;
                default:                                      UNEXPECTED("Unknown ray tracing shader binding mode");
                    // clang-format on
            }
        }
        else
        {
            VERIFY(BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED, "BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
        }

        constexpr Uint32 MaxIndex = (1u << 24);
        VERIFY(Desc.ContributionToHitGroupIndex < MaxIndex, "ContributionToHitGroupIndex must be less than ", MaxIndex);
    }